

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O0

SRes LookToRead_Look_Exact(void *pp,void **buf,size_t *size)

{
  ulong local_38;
  size_t size2;
  CLookToRead *p;
  SRes res;
  size_t *size_local;
  void **buf_local;
  void *pp_local;
  
  p._4_4_ = 0;
  local_38 = *(long *)((long)pp + 0x30) - *(long *)((long)pp + 0x28);
  if ((local_38 == 0) && (*size != 0)) {
    *(undefined8 *)((long)pp + 0x28) = 0;
    if (0x4000 < *size) {
      *size = 0x4000;
    }
    p._4_4_ = (*(code *)**(undefined8 **)((long)pp + 0x20))
                        (*(undefined8 *)((long)pp + 0x20),(long)pp + 0x38,size);
    local_38 = *size;
    *(ulong *)((long)pp + 0x30) = local_38;
  }
  if (local_38 < *size) {
    *size = local_38;
  }
  *buf = (void *)((long)pp + *(long *)((long)pp + 0x28) + 0x38);
  return p._4_4_;
}

Assistant:

static SRes LookToRead_Look_Exact(void *pp, const void **buf, size_t *size)
{
  SRes res = SZ_OK;
  CLookToRead *p = (CLookToRead *)pp;
  size_t size2 = p->size - p->pos;
  if (size2 == 0 && *size > 0)
  {
    p->pos = 0;
    if (*size > LookToRead_BUF_SIZE)
      *size = LookToRead_BUF_SIZE;
    res = p->realStream->Read(p->realStream, p->buf, size);
    size2 = p->size = *size;
  }
  if (size2 < *size)
    *size = size2;
  *buf = p->buf + p->pos;
  return res;
}